

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int qRegisterNormalizedMetaTypeImplementation<QNetworkDatagram>(QByteArray *normalizedTypeName)

{
  bool bVar1;
  int iVar2;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  int id;
  QMetaType metaType;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d_ptr = (QMetaTypeInterface *)0xaaaaaaaaaaaaaaaa;
  local_10 = QMetaType::fromType<QNetworkDatagram>();
  iVar2 = QMetaType::id((QMetaType *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
  QtPrivate::SequentialContainerTransformationHelper<QNetworkDatagram,_false>::registerConverter();
  QtPrivate::SequentialContainerTransformationHelper<QNetworkDatagram,_false>::registerMutableView()
  ;
  QtPrivate::AssociativeContainerTransformationHelper<QNetworkDatagram,_false>::registerConverter();
  QtPrivate::AssociativeContainerTransformationHelper<QNetworkDatagram,_false>::registerMutableView
            ();
  QtPrivate::IsPair<QNetworkDatagram>::registerConverter();
  QtPrivate::MetaTypeSmartPointerHelper<QNetworkDatagram,_void>::registerConverter();
  QtPrivate::MetaTypeQFutureHelper<QNetworkDatagram>::registerConverter();
  QMetaType::name(&local_10);
  bVar1 = operator!=(in_RDI,(char **)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
  if (bVar1) {
    QMetaType::registerNormalizedTypedef(in_RDI,(QMetaType *)local_10.d_ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int qRegisterNormalizedMetaTypeImplementation(const QT_PREPEND_NAMESPACE(QByteArray) &normalizedTypeName)
{
#ifndef QT_NO_QOBJECT
    Q_ASSERT_X(normalizedTypeName == QMetaObject::normalizedType(normalizedTypeName.constData()),
               "qRegisterNormalizedMetaType",
               "qRegisterNormalizedMetaType was called with a not normalized type name, "
               "please call qRegisterMetaType instead.");
#endif

    const QMetaType metaType = QMetaType::fromType<T>();
    const int id = metaType.id();

    QtPrivate::SequentialContainerTransformationHelper<T>::registerConverter();
    QtPrivate::SequentialContainerTransformationHelper<T>::registerMutableView();
    QtPrivate::AssociativeContainerTransformationHelper<T>::registerConverter();
    QtPrivate::AssociativeContainerTransformationHelper<T>::registerMutableView();
    QtPrivate::MetaTypePairHelper<T>::registerConverter();
    QtPrivate::MetaTypeSmartPointerHelper<T>::registerConverter();
#if QT_CONFIG(future)
    QtPrivate::MetaTypeQFutureHelper<T>::registerConverter();
#endif

    if (normalizedTypeName != metaType.name())
        QMetaType::registerNormalizedTypedef(normalizedTypeName, metaType);

    return id;
}